

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcontainertools_impl.h
# Opt level: O3

void QtPrivate::
     q_relocate_overlap_n_left_move<std::reverse_iterator<QSocks5RevivedDatagram*>,long_long>
               (reverse_iterator<QSocks5RevivedDatagram_*> first,longlong n,
               reverse_iterator<QSocks5RevivedDatagram_*> d_first)

{
  QSocks5RevivedDatagram *pQVar1;
  Data *pDVar2;
  char *pcVar3;
  qsizetype qVar4;
  QHostAddressPrivate *pQVar5;
  int *piVar6;
  QSocks5RevivedDatagram *pQVar7;
  QSocks5RevivedDatagram *pQVar8;
  QSocks5RevivedDatagram *pQVar9;
  long in_FS_OFFSET;
  Destructor local_38;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  local_38.end.current = (QSocks5RevivedDatagram *)((d_first.current)->data).d.d;
  pQVar1 = local_38.end.current + -n;
  pQVar9 = (QSocks5RevivedDatagram *)((first.current)->data).d.d;
  local_38.intermediate.current = local_38.end.current;
  pQVar7 = pQVar1;
  pQVar8 = pQVar9;
  if (pQVar1 < pQVar9) {
    pQVar7 = pQVar9;
    pQVar8 = pQVar1;
  }
  while (local_38.intermediate.current != pQVar7) {
    pDVar2 = pQVar9[-1].data.d.d;
    pQVar9[-1].data.d.d = (Data *)0x0;
    local_38.intermediate.current[-1].data.d.d = pDVar2;
    pcVar3 = pQVar9[-1].data.d.ptr;
    pQVar9[-1].data.d.ptr = (char *)0x0;
    local_38.intermediate.current[-1].data.d.ptr = pcVar3;
    qVar4 = pQVar9[-1].data.d.size;
    pQVar9[-1].data.d.size = 0;
    local_38.intermediate.current[-1].data.d.size = qVar4;
    pQVar5 = pQVar9[-1].address.d.d.ptr;
    pQVar9[-1].address.d.d.ptr = (QHostAddressPrivate *)0x0;
    local_38.intermediate.current[-1].address.d.d.ptr = pQVar5;
    local_38.intermediate.current[-1].port = pQVar9[-1].port;
    ((d_first.current)->data).d.d =
         (Data *)&((d_first.current)->data).d.d[-3].super_QArrayData.alloc;
    pQVar9 = (QSocks5RevivedDatagram *)&((first.current)->data).d.d[-3].super_QArrayData.alloc;
    ((first.current)->data).d.d = (Data *)pQVar9;
    local_38.intermediate.current = (QSocks5RevivedDatagram *)((d_first.current)->data).d.d;
  }
  local_38.iter = &local_38.end;
  pQVar7 = local_38.intermediate.current;
  while (pQVar7 != pQVar1) {
    pDVar2 = pQVar7[-1].data.d.d;
    pQVar7[-1].data.d.d = pQVar9[-1].data.d.d;
    pQVar9[-1].data.d.d = pDVar2;
    pcVar3 = pQVar7[-1].data.d.ptr;
    pQVar7[-1].data.d.ptr = pQVar9[-1].data.d.ptr;
    pQVar9[-1].data.d.ptr = pcVar3;
    qVar4 = pQVar7[-1].data.d.size;
    pQVar7[-1].data.d.size = pQVar9[-1].data.d.size;
    pQVar9[-1].data.d.size = qVar4;
    pQVar5 = pQVar7[-1].address.d.d.ptr;
    pQVar7[-1].address.d.d.ptr = pQVar9[-1].address.d.d.ptr;
    pQVar9[-1].address.d.d.ptr = pQVar5;
    pQVar7[-1].port = pQVar9[-1].port;
    ((d_first.current)->data).d.d =
         (Data *)&((d_first.current)->data).d.d[-3].super_QArrayData.alloc;
    pQVar9 = (QSocks5RevivedDatagram *)&((first.current)->data).d.d[-3].super_QArrayData.alloc;
    ((first.current)->data).d.d = (Data *)pQVar9;
    pQVar7 = (QSocks5RevivedDatagram *)((d_first.current)->data).d.d;
  }
  while (pQVar9 != pQVar8) {
    ((first.current)->data).d.d = (Data *)(pQVar9 + 1);
    QHostAddress::~QHostAddress(&pQVar9->address);
    piVar6 = *(int **)&(pQVar9->data).d.d;
    if (piVar6 != (int *)0x0) {
      LOCK();
      *piVar6 = *piVar6 + -1;
      UNLOCK();
      if (*piVar6 == 0) {
        QArrayData::deallocate(*(QArrayData **)&(pQVar9->data).d.d,1,0x10);
      }
    }
    pQVar9 = (QSocks5RevivedDatagram *)((first.current)->data).d.d;
  }
  q_relocate_overlap_n_left_move<std::reverse_iterator<QSocks5RevivedDatagram_*>,_long_long>::
  Destructor::~Destructor(&local_38);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void q_relocate_overlap_n_left_move(iterator first, N n, iterator d_first)
{
    // requires: [first, n) is a valid range
    // requires: d_first + n is reachable from d_first
    // requires: iterator is at least a random access iterator
    // requires: value_type(iterator) has a non-throwing destructor

    Q_ASSERT(n);
    Q_ASSERT(d_first < first); // only allow moves to the "left"
    using T = typename std::iterator_traits<iterator>::value_type;

    // Watches passed iterator. Unless commit() is called, all the elements that
    // the watched iterator passes through are deleted at the end of object
    // lifetime. freeze() could be used to stop watching the passed iterator and
    // remain at current place.
    //
    // requires: the iterator is expected to always point to an invalid object
    //           (to uninitialized memory)
    struct Destructor
    {
        iterator *iter;
        iterator end;
        iterator intermediate;

        Destructor(iterator &it) noexcept : iter(std::addressof(it)), end(it) { }
        void commit() noexcept { iter = std::addressof(end); }
        void freeze() noexcept
        {
            intermediate = *iter;
            iter = std::addressof(intermediate);
        }
        ~Destructor() noexcept
        {
            for (const int step = *iter < end ? 1 : -1; *iter != end;) {
                std::advance(*iter, step);
                (*iter)->~T();
            }
        }
    } destroyer(d_first);

    const iterator d_last = d_first + n;
    // Note: use pair and explicitly copy iterators from it to prevent
    // accidental reference semantics instead of copy. equivalent to:
    //
    // auto [overlapBegin, overlapEnd] = std::minmax(d_last, first);
    auto pair = std::minmax(d_last, first);

    // overlap area between [d_first, d_first + n) and [first, first + n) or an
    // uninitialized memory area between the two ranges
    iterator overlapBegin = pair.first;
    iterator overlapEnd = pair.second;

    // move construct elements in uninitialized region
    while (d_first != overlapBegin) {
        // account for std::reverse_iterator, cannot use new(d_first) directly
        new (std::addressof(*d_first)) T(std::move_if_noexcept(*first));
        ++d_first;
        ++first;
    }

    // cannot commit but have to stop - there might be an overlap region
    // which we don't want to delete (because it's part of existing data)
    destroyer.freeze();

    // move assign elements in overlap region
    while (d_first != d_last) {
        *d_first = std::move_if_noexcept(*first);
        ++d_first;
        ++first;
    }

    Q_ASSERT(d_first == destroyer.end + n);
    destroyer.commit(); // can commit here as ~T() below does not throw

    while (first != overlapEnd)
        (--first)->~T();
}